

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O3

h__Writer * __thiscall ASDCP::TimedText::MXFWriter::h__Writer::Finalize(h__Writer *this)

{
  long in_RSI;
  Result_t local_80 [104];
  
  if (*(int *)(in_RSI + 0x370) == 3) {
    *(undefined4 *)(in_RSI + 0x338) = *(undefined4 *)(in_RSI + 0x6f8);
    *(undefined4 *)(in_RSI + 0x370) = 4;
    Kumu::Result_t::Result_t(local_80,(Result_t *)Kumu::RESULT_OK);
    Kumu::Result_t::~Result_t(local_80);
    h__ASDCPWriter::WriteASDCPFooter(&this->super_h__ASDCPWriter);
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFWriter::h__Writer::Finalize()
{
  if ( ! m_State.Test_RUNNING() )
    return RESULT_STATE;
  m_FramesWritten = m_TDesc.ContainerDuration;
  m_State.Goto_FINAL();

  return WriteASDCPFooter();
}